

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DPIExportSyntax::getChild(DPIExportSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  Token token_05;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff48;
  TokenOrSyntax *in_stack_ffffffffffffff50;
  nullptr_t in_stack_ffffffffffffff58;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff48);
    break;
  case 1:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token);
    break;
  case 2:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_00);
    break;
  case 3:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_01);
    break;
  case 4:
    token_02.info = in_RDI;
    token_02._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_02);
    break;
  case 5:
    token_03.info = in_RDI;
    token_03._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_03);
    break;
  case 6:
    token_04.info = in_RDI;
    token_04._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_04);
    break;
  case 7:
    token_05.info = in_RDI;
    token_05._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_05);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffff58);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax DPIExportSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return specString;
        case 3: return c_identifier;
        case 4: return equals;
        case 5: return functionOrTask;
        case 6: return name;
        case 7: return semi;
        default: return nullptr;
    }
}